

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_compute_forward_concat(ggml_compute_params *params,ggml_tensor *dst)

{
  int iVar1;
  long in_RSI;
  ggml_tensor *src0;
  ggml_tensor *in_stack_000000f8;
  ggml_compute_params *in_stack_00000100;
  
  iVar1 = **(int **)(in_RSI + 0x98);
  if (iVar1 == 0) {
LAB_00198a39:
    ggml_compute_forward_concat_f32(in_stack_00000100,in_stack_000000f8);
  }
  else {
    if (iVar1 != 1) {
      if (iVar1 == 0x18) {
        ggml_compute_forward_concat_i8(in_stack_00000100,in_stack_000000f8);
        return;
      }
      if (iVar1 != 0x19) {
        if (iVar1 == 0x1a) goto LAB_00198a39;
        if (iVar1 != 0x1e) {
          ggml_compute_forward_concat_any(in_stack_00000100,in_stack_000000f8);
          return;
        }
      }
    }
    ggml_compute_forward_concat_f16(in_stack_00000100,in_stack_000000f8);
  }
  return;
}

Assistant:

void ggml_compute_forward_concat(
    const ggml_compute_params * params,
    ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F16:
        case GGML_TYPE_BF16:
        case GGML_TYPE_I16:
            {
                ggml_compute_forward_concat_f16(params, dst);
            } break;
        case GGML_TYPE_I8:
            {
                ggml_compute_forward_concat_i8(params, dst);
            } break;
        case GGML_TYPE_F32:
        case GGML_TYPE_I32:
            {
                ggml_compute_forward_concat_f32(params, dst);
            } break;
        default:
            {
                ggml_compute_forward_concat_any(params, dst);
            }
    }
}